

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPPacketBuilder::FillInSDES
          (RTCPPacketBuilder *this,RTCPCompoundPacketBuilder *rtcpcomppack,bool *full,
          bool *processedall,int *added)

{
  bool bVar1;
  uint8_t local_50 [8];
  size_t datalen;
  uint8_t *data;
  int *piStack_38;
  int status;
  int *added_local;
  bool *processedall_local;
  bool *full_local;
  RTCPCompoundPacketBuilder *rtcpcomppack_local;
  RTCPPacketBuilder *this_local;
  
  *full = false;
  *processedall = false;
  *added = 0;
  piStack_38 = added;
  added_local = (int *)processedall;
  processedall_local = full;
  full_local = (bool *)rtcpcomppack;
  rtcpcomppack_local = (RTCPCompoundPacketBuilder *)this;
  if (((this->doname & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedName(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetName
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,NAME,(void *)datalen,local_50[0]
                           );
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedName(&this->ownsdesinfo,true);
  }
  if (((this->doemail & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedEMail(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetEMail
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,EMAIL,(void *)datalen,
                            local_50[0]);
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedEMail(&this->ownsdesinfo,true);
  }
  if (((this->doloc & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedLocation(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetLocation
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,LOC,(void *)datalen,local_50[0])
    ;
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedLocation(&this->ownsdesinfo,true);
  }
  if (((this->dophone & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedPhone(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetPhone
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,PHONE,(void *)datalen,
                            local_50[0]);
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedPhone(&this->ownsdesinfo,true);
  }
  if (((this->dotool & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedTool(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetTool
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,TOOL,(void *)datalen,local_50[0]
                           );
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedTool(&this->ownsdesinfo,true);
  }
  if (((this->donote & 1U) != 0) &&
     (bVar1 = RTCPSDESInfoInternal::ProcessedNote(&this->ownsdesinfo), !bVar1)) {
    datalen = (size_t)RTCPSDESInfo::GetNote
                                (&(this->ownsdesinfo).super_RTCPSDESInfo,(size_t *)local_50);
    data._4_4_ = RTCPCompoundPacketBuilder::AddSDESNormalItem
                           ((RTCPCompoundPacketBuilder *)full_local,NOTE,(void *)datalen,local_50[0]
                           );
    if ((data._4_4_ < 0) && (data._4_4_ == -0x2b)) {
      *processedall_local = true;
      return 0;
    }
    *piStack_38 = *piStack_38 + 1;
    RTCPSDESInfoInternal::SetProcessedNote(&this->ownsdesinfo,true);
  }
  *(undefined1 *)added_local = 1;
  return 0;
}

Assistant:

int RTCPPacketBuilder::FillInSDES(RTCPCompoundPacketBuilder *rtcpcomppack,bool *full,bool *processedall,int *added)
{
	int status;
	uint8_t *data;
	size_t datalen;
	
	*full = false;
	*processedall = false;
	*added = 0;

	// We don't need to add a SSRC for our own data, this is still set
	// from adding the CNAME
	if (doname)
	{
		if (!ownsdesinfo.ProcessedName())
		{
			data = ownsdesinfo.GetName(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::NAME,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedName(true);
		}
	}
	if (doemail)
	{
		if (!ownsdesinfo.ProcessedEMail())
		{
			data = ownsdesinfo.GetEMail(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::EMAIL,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedEMail(true);
		}
	}
	if (doloc)
	{
		if (!ownsdesinfo.ProcessedLocation())
		{
			data = ownsdesinfo.GetLocation(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::LOC,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedLocation(true);
		}
	}
	if (dophone)
	{
		if (!ownsdesinfo.ProcessedPhone())
		{
			data = ownsdesinfo.GetPhone(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::PHONE,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedPhone(true);
		}
	}
	if (dotool)
	{
		if (!ownsdesinfo.ProcessedTool())
		{
			data = ownsdesinfo.GetTool(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::TOOL,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedTool(true);
		}
	}
	if (donote)
	{
		if (!ownsdesinfo.ProcessedNote())
		{
			data = ownsdesinfo.GetNote(&datalen);
			if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::NOTE,data,datalen)) < 0)
			{
				if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				{
					*full = true;
					return 0;
				}
			}
			(*added)++;
			ownsdesinfo.SetProcessedNote(true);
		}
	}

	*processedall = true;
	return 0;
}